

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void duckdb::TypedModeFunction<duckdb::ModeStandard<unsigned_long>>::
     ConstantOperation<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_long>>>
               (ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> *state,
               unsigned_long *key,AggregateUnaryInput *aggr_input,idx_t count)

{
  MAP_TYPE *pMVar1;
  mapped_type *pmVar2;
  unsigned_long uVar3;
  ArenaAllocator *in_RCX;
  long in_RDI;
  mapped_type *i;
  key_type *in_stack_ffffffffffffffd8;
  
  if (*(long *)(in_RDI + 0x18) == 0) {
    pMVar1 = ModeStandard<unsigned_long>::CreateEmpty(in_RCX);
    *(MAP_TYPE **)(in_RDI + 0x18) = pMVar1;
  }
  pmVar2 = ::std::
           unordered_map<unsigned_long,_duckdb::ModeAttr,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::ModeAttr>_>_>
           ::operator[]((unordered_map<unsigned_long,_duckdb::ModeAttr,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::ModeAttr>_>_>
                         *)in_RCX,in_stack_ffffffffffffffd8);
  pmVar2->count = (long)&in_RCX->allocator + pmVar2->count;
  uVar3 = MinValue<unsigned_long>(pmVar2->first_row,*(unsigned_long *)(in_RDI + 0x38));
  pmVar2->first_row = uVar3;
  *(long *)(in_RDI + 0x38) = (long)&in_RCX->allocator + *(long *)(in_RDI + 0x38);
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &key, AggregateUnaryInput &aggr_input, idx_t count) {
		if (!state.frequency_map) {
			state.frequency_map = TYPE_OP::CreateEmpty(aggr_input.input.allocator);
		}
		auto &i = (*state.frequency_map)[key];
		i.count += count;
		i.first_row = MinValue<idx_t>(i.first_row, state.count);
		state.count += count;
	}